

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128a.c
# Opt level: O0

size_t ascon_aead128a_decrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *plaintext,_Bool *is_tag_valid,uint8_t *expected_tag
                 ,size_t expected_tag_len)

{
  uint_fast8_t n;
  _Bool _Var1;
  uint64_t uVar2;
  uint64_t uVar3;
  size_t expected_tag_len_00;
  ascon_aead_ctx_t *in_RCX;
  undefined8 in_RDX;
  uint8_t *in_RSI;
  ascon_aead_ctx_t *in_RDI;
  uint8_t *in_R8;
  uint64_t c_0_1;
  uint64_t c_1;
  uint_fast8_t second_half;
  uint64_t c_0;
  size_t freshly_generated_plaintext_len;
  ascon_aead_ctx_t *in_stack_ffffffffffffffb0;
  long lVar4;
  
  if ((in_RDI->bufstate).flow_state != '\n') {
    ascon_128a_finalise_assoc_data(in_stack_ffffffffffffffb0);
  }
  lVar4 = 0;
  if ((in_RDI->bufstate).buffer_len < 8) {
    uVar2 = bigendian_decode_varlen((in_RDI->bufstate).buffer,(in_RDI->bufstate).buffer_len);
    bigendian_encode_varlen
              (in_RSI,(in_RDI->bufstate).sponge.x0 ^ uVar2,(in_RDI->bufstate).buffer_len);
    uVar3 = mask_most_signif_bytes((in_RDI->bufstate).buffer_len);
    (in_RDI->bufstate).sponge.x0 = (uVar3 ^ 0xffffffffffffffff) & (in_RDI->bufstate).sponge.x0;
    (in_RDI->bufstate).sponge.x0 = uVar2 | (in_RDI->bufstate).sponge.x0;
    (in_RDI->bufstate).sponge.x0 =
         0x80L << ((in_RDI->bufstate).buffer_len * -8 + 0x38 & 0x3f) ^ (in_RDI->bufstate).sponge.x0;
  }
  else {
    uVar2 = bigendian_decode_u64((in_RDI->bufstate).buffer);
    n = (in_RDI->bufstate).buffer_len + 0xf8;
    uVar3 = bigendian_decode_varlen((in_RDI->bufstate).buffer + 8,n);
    bigendian_encode_u64(in_RSI,(in_RDI->bufstate).sponge.x0 ^ uVar2);
    bigendian_encode_varlen(in_RSI + 8,(in_RDI->bufstate).sponge.x1 ^ uVar3,n);
    (in_RDI->bufstate).sponge.x0 = uVar2;
    uVar2 = mask_most_signif_bytes(n);
    (in_RDI->bufstate).sponge.x1 = (uVar2 ^ 0xffffffffffffffff) & (in_RDI->bufstate).sponge.x1;
    (in_RDI->bufstate).sponge.x1 = uVar3 | (in_RDI->bufstate).sponge.x1;
    (in_RDI->bufstate).sponge.x1 = 0x80L << (n * -8 + 0x38 & 0x3f) ^ (in_RDI->bufstate).sponge.x1;
  }
  expected_tag_len_00 = (ulong)(in_RDI->bufstate).buffer_len + lVar4;
  (in_RDI->bufstate).sponge.x2 = in_RDI->k0 ^ (in_RDI->bufstate).sponge.x2;
  (in_RDI->bufstate).sponge.x3 = in_RDI->k1 ^ (in_RDI->bufstate).sponge.x3;
  ascon_permutation_12((ascon_sponge_t *)0x1040a6);
  (in_RDI->bufstate).sponge.x3 = in_RDI->k0 ^ (in_RDI->bufstate).sponge.x3;
  (in_RDI->bufstate).sponge.x4 = in_RDI->k1 ^ (in_RDI->bufstate).sponge.x4;
  _Var1 = ascon_aead_is_tag_valid(in_RCX,in_R8,expected_tag_len_00);
  *(_Bool *)in_RDX = _Var1;
  ascon_aead_cleanup(in_RDI);
  return expected_tag_len_00;
}

Assistant:

ASCON_API size_t
ascon_aead128a_decrypt_final(ascon_aead_ctx_t* const ctx,
                             uint8_t* plaintext,
                             bool* const is_tag_valid,
                             const uint8_t* const expected_tag,
                             const size_t expected_tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(plaintext != NULL);
    ASCON_ASSERT(expected_tag_len == 0 || expected_tag != NULL);
    ASCON_ASSERT(is_tag_valid != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128a_DECRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128a_DECRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_128a_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_plaintext_len = 0;
    // If there is any remaining less-than-a-block ciphertext to be absorbed
    // cached in the buffer, pad it and absorb it.
    if (ctx->bufstate.buffer_len >= ASCON_RATE)
    {
        // Absorb ciphertext in buffer
        const uint64_t c_0 = bigendian_decode_u64(ctx->bufstate.buffer);
        const uint_fast8_t second_half =
                (uint_fast8_t) (ctx->bufstate.buffer_len - ASCON_RATE);
        const uint64_t c_1 = bigendian_decode_varlen(
                ctx->bufstate.buffer + ASCON_RATE, second_half);
        // Squeeze out last plaintext bytes
        bigendian_encode_u64(plaintext, ctx->bufstate.sponge.x0 ^ c_0);
        bigendian_encode_varlen(plaintext + ASCON_RATE,
                                ctx->bufstate.sponge.x1 ^ c_1,
                                second_half);
        // Final state changes at decryption's end
        ctx->bufstate.sponge.x0 = c_0;
        ctx->bufstate.sponge.x1 &= ~mask_most_signif_bytes(second_half);
        ctx->bufstate.sponge.x1 |= c_1;
        ctx->bufstate.sponge.x1 ^= PADDING(second_half);
    }
    else
    {
        // Absorb ciphertext in buffer
        const uint64_t c_0 = bigendian_decode_varlen(ctx->bufstate.buffer,
                                                     ctx->bufstate.buffer_len);
        // Squeeze out last plaintext bytes
        bigendian_encode_varlen(plaintext, ctx->bufstate.sponge.x0 ^ c_0,
                                ctx->bufstate.buffer_len);
        // Final state changes at decryption's end
        ctx->bufstate.sponge.x0 &= ~mask_most_signif_bytes(ctx->bufstate.buffer_len);
        ctx->bufstate.sponge.x0 |= c_0;
        ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    }
    freshly_generated_plaintext_len += ctx->bufstate.buffer_len;
    // End of decryption, start of tag validation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x2 ^= ctx->k0;
    ctx->bufstate.sponge.x3 ^= ctx->k1;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    // Validate tag with variable len
    *is_tag_valid = ascon_aead_is_tag_valid(ctx, expected_tag, expected_tag_len);
    // Final security cleanup of the internal state and key.
    ascon_aead_cleanup(ctx);
    return freshly_generated_plaintext_len;
}